

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constants.cpp
# Opt level: O0

Constant * __thiscall
spvtools::opt::analysis::ConstantManager::GetConstantFromInst
          (ConstantManager *this,Instruction *inst)

{
  uint uVar1;
  uint32_t uVar2;
  Op OVar3;
  Operand *pOVar4;
  const_iterator __first;
  const_iterator __last;
  Type *type;
  value_type_conflict2 local_60 [2];
  uint *local_58;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_50;
  const_iterator local_48;
  uint local_3c;
  undefined1 local_38 [4];
  uint32_t i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> literal_words_or_ids;
  Instruction *inst_local;
  ConstantManager *this_local;
  
  literal_words_or_ids.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)inst;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  for (local_3c = 0; uVar1 = local_3c,
      uVar2 = Instruction::NumInOperands
                        ((Instruction *)
                         literal_words_or_ids.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage), uVar1 < uVar2;
      local_3c = local_3c + 1) {
    local_50._M_current =
         (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
    __gnu_cxx::
    __normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>::
    __normal_iterator<unsigned_int*>
              ((__normal_iterator<unsigned_int_const*,std::vector<unsigned_int,std::allocator<unsigned_int>>>
                *)&local_48,&local_50);
    pOVar4 = Instruction::GetInOperand
                       ((Instruction *)
                        literal_words_or_ids.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,local_3c);
    __first = utils::SmallVector<unsigned_int,_2UL>::begin(&pOVar4->words);
    pOVar4 = Instruction::GetInOperand
                       ((Instruction *)
                        literal_words_or_ids.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,local_3c);
    __last = utils::SmallVector<unsigned_int,_2UL>::end(&pOVar4->words);
    local_58 = (uint *)std::vector<unsigned_int,std::allocator<unsigned_int>>::
                       insert<unsigned_int_const*,void>
                                 ((vector<unsigned_int,std::allocator<unsigned_int>> *)local_38,
                                  local_48,__first,__last);
  }
  OVar3 = Instruction::opcode((Instruction *)
                              literal_words_or_ids.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (OVar3 == OpConstantTrue) {
    local_60[1] = 1;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,local_60 + 1);
  }
  else if (OVar3 == OpConstantFalse) {
    local_60[0] = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38,local_60);
  }
  else if (((1 < OVar3 - OpConstant) && (OVar3 != OpConstantNull)) &&
          (OVar3 != OpSpecConstantComposite)) {
    this_local = (ConstantManager *)0x0;
    goto LAB_0030870e;
  }
  type = GetType(this,(Instruction *)
                      literal_words_or_ids.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  this_local = (ConstantManager *)
               GetConstant(this,type,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38
                          );
LAB_0030870e:
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_38);
  return (Constant *)this_local;
}

Assistant:

const Constant* ConstantManager::GetConstantFromInst(const Instruction* inst) {
  std::vector<uint32_t> literal_words_or_ids;

  // Collect the constant defining literals or component ids.
  for (uint32_t i = 0; i < inst->NumInOperands(); i++) {
    literal_words_or_ids.insert(literal_words_or_ids.end(),
                                inst->GetInOperand(i).words.begin(),
                                inst->GetInOperand(i).words.end());
  }

  switch (inst->opcode()) {
    // OpConstant{True|False} have the value embedded in the opcode. So they
    // are not handled by the for-loop above. Here we add the value explicitly.
    case spv::Op::OpConstantTrue:
      literal_words_or_ids.push_back(true);
      break;
    case spv::Op::OpConstantFalse:
      literal_words_or_ids.push_back(false);
      break;
    case spv::Op::OpConstantNull:
    case spv::Op::OpConstant:
    case spv::Op::OpConstantComposite:
    case spv::Op::OpSpecConstantComposite:
      break;
    default:
      return nullptr;
  }

  return GetConstant(GetType(inst), literal_words_or_ids);
}